

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

char * xatlas::StringForEnum(Enum category)

{
  char *pcStack_10;
  Enum category_local;
  
  if (category == AddMesh) {
    pcStack_10 = "Adding mesh(es)";
  }
  else if (category == ComputeCharts) {
    pcStack_10 = "Computing charts";
  }
  else if (category == ParameterizeCharts) {
    pcStack_10 = "Parameterizing charts";
  }
  else if (category == PackCharts) {
    pcStack_10 = "Packing charts";
  }
  else if (category == BuildOutputMeshes) {
    pcStack_10 = "Building output meshes";
  }
  else {
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

const char *StringForEnum(ProgressCategory::Enum category)
{
	if (category == ProgressCategory::AddMesh)
		return "Adding mesh(es)";
	if (category == ProgressCategory::ComputeCharts)
		return "Computing charts";
	if (category == ProgressCategory::ParameterizeCharts)
		return "Parameterizing charts";
	if (category == ProgressCategory::PackCharts)
		return "Packing charts";
	if (category == ProgressCategory::BuildOutputMeshes)
		return "Building output meshes";
	return "";
}